

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDEdgePtr __thiscall ON_SubDVertex::CreasedEdge(ON_SubDVertex *this,bool bInteriorEdgesOnly)

{
  bool bVar1;
  bool bVar2;
  ON__UINT_PTR in_RAX;
  ON__UINT_PTR OVar3;
  ON__UINT_PTR OVar4;
  ulong uVar5;
  ON_SubDEdge *this_00;
  ON__UINT_PTR local_38;
  
  OVar3 = 0;
  OVar4 = OVar3;
  if ((this->m_edges != (ON_SubDEdgePtr *)0x0) && (this->m_edge_count != 0)) {
    uVar5 = 0;
    local_38 = in_RAX;
    do {
      bVar1 = false;
      this_00 = (ON_SubDEdge *)(this->m_edges[uVar5].m_ptr & 0xfffffffffffffff8);
      if ((this_00 != (ON_SubDEdge *)0x0) &&
         (((!bInteriorEdgesOnly ||
           (bVar2 = ON_SubDEdge::HasInteriorEdgeTopology(this_00,false), bVar2)) &&
          (bVar1 = false, this_00->m_edge_tag == Crease)))) {
        if (OVar3 < 8) {
          OVar3 = this->m_edges[uVar5].m_ptr;
        }
        else {
          local_38 = 0;
          bVar1 = true;
        }
      }
      OVar4 = local_38;
    } while ((!bVar1) && (uVar5 = uVar5 + 1, OVar4 = OVar3, uVar5 < this->m_edge_count));
  }
  return (ON_SubDEdgePtr)OVar4;
}

Assistant:

const ON_SubDEdgePtr ON_SubDVertex::CreasedEdge(bool bInteriorEdgesOnly) const
{
  ON_SubDEdgePtr creased_eptr = ON_SubDEdgePtr::Null;
  if (nullptr != m_edges)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e)
        continue;
      if (bInteriorEdgesOnly && false == e->HasInteriorEdgeTopology(false))
        continue;
      if (ON_SubDEdgeTag::Crease == e->m_edge_tag)
      {
        if (creased_eptr.IsNull())
          creased_eptr = m_edges[vei];
        else
          return ON_SubDEdgePtr::Null; // 2 or more creases.
      }
    }
  }
  return creased_eptr;
}